

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytes.cc
# Opt level: O0

t_object * xemmai::t_bytes::f_instantiate(size_t a_size)

{
  t_global *this;
  t_type *a_class;
  t_object *ptVar1;
  size_t a_size_local;
  
  this = f_global();
  a_class = t_global::f_type<xemmai::t_bytes>(this);
  ptVar1 = t_type_of<xemmai::t_bytes>::f__construct(a_class,a_size);
  return ptVar1;
}

Assistant:

t_object* t_bytes::f_instantiate(size_t a_size)
{
	return t_type_of<t_bytes>::f__construct(f_global()->f_type<t_bytes>(), a_size);
}